

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darLib.c
# Opt level: O3

void Dar2_LibEvalAssignNums(Gia_Man_t *p,int Class)

{
  int iVar1;
  uint uVar2;
  Dar_LibObj_t *pDVar3;
  Dar_LibDat_t *pDVar4;
  Dar_LibObj_t DVar5;
  Dar_LibDat_t *pDVar6;
  Gia_Obj_t *pGVar7;
  Vec_Int_t *p_00;
  Dar_Lib_t *pDVar8;
  uint uVar9;
  uint uVar10;
  Gia_Obj_t *pGVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar14;
  
  if (0 < s_DarLib->nNodes0[Class]) {
    lVar18 = 0;
    do {
      pDVar8 = s_DarLib;
      iVar1 = s_DarLib->pNodes0[Class][lVar18];
      pDVar3 = s_DarLib->pObjs;
      uVar13 = (int)lVar18 + 4U & 0xfffffff;
      uVar14 = (ulong)uVar13;
      pDVar3[iVar1] = (Dar_LibObj_t)((ulong)pDVar3[iVar1] & 0xfffffffff | uVar14 << 0x24);
      if (pDVar8->nNodes0Max + 4 <= (int)uVar13) {
        __assert_fail("(int)pObj->Num < s_DarLib->nNodes0Max + 4",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darLib.c"
                      ,0x44a,"void Dar2_LibEvalAssignNums(Gia_Man_t *, int)");
      }
      pDVar4 = pDVar8->pDatas;
      pDVar4[uVar14].fMffc = '\0';
      pDVar4[uVar14].field_0.iGunc = -1;
      pDVar4[uVar14].TravId = 0xffff;
      DVar5 = pDVar8->pObjs[SUB84(pDVar3[iVar1],0) & 0xffff];
      uVar15 = (ulong)DVar5 >> 0x24;
      uVar13 = pDVar8->nNodes0Max + 4;
      if ((int)uVar13 <= (int)(DVar5._4_4_ >> 4)) {
        __assert_fail("(int)Dar_LibObj(s_DarLib, pObj->Fan0)->Num < s_DarLib->nNodes0Max + 4",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darLib.c"
                      ,0x451,"void Dar2_LibEvalAssignNums(Gia_Man_t *, int)");
      }
      DVar5 = pDVar8->pObjs[SUB84(pDVar3[iVar1],0) >> 0x10];
      uVar17 = (ulong)DVar5 >> 0x24;
      if (uVar13 <= DVar5._4_4_ >> 4) {
        __assert_fail("(int)Dar_LibObj(s_DarLib, pObj->Fan1)->Num < s_DarLib->nNodes0Max + 4",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darLib.c"
                      ,0x452,"void Dar2_LibEvalAssignNums(Gia_Man_t *, int)");
      }
      pDVar4 = pDVar4 + uVar14;
      pDVar6 = pDVar8->pDatas;
      iVar16 = pDVar6[uVar17].Level;
      if (pDVar6[uVar17].Level < pDVar6[uVar15].Level) {
        iVar16 = pDVar6[uVar15].Level;
      }
      pDVar4->Level = iVar16 + 1;
      uVar13 = pDVar6[uVar15].field_0.iGunc;
      if ((uVar13 == 0xffffffff) || (uVar2 = pDVar6[uVar17].field_0.iGunc, uVar2 == 0xffffffff))
      goto LAB_004f6f99;
      if (((int)uVar13 < 0) || ((int)uVar2 < 0)) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar12 = SUB84(pDVar3[iVar1],4) & 1;
      uVar9 = 0;
      if ((uVar12 == uVar13) ||
         (uVar10 = SUB84(pDVar3[iVar1],4) >> 1 & 1, uVar9 = 0, uVar10 == uVar2)) {
LAB_004f6efe:
        (pDVar4->field_0).iGunc = uVar9;
LAB_004f6f02:
        if (p->nObjs <= (int)(uVar9 >> 1)) {
LAB_004f70c2:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        pGVar7 = p->pObjs;
        pGVar11 = (Gia_Obj_t *)((ulong)(pGVar7 + (uVar9 >> 1)) & 0xfffffffffffffffe);
        if ((pGVar11 < pGVar7) || (pGVar7 + (uint)p->nObjs <= pGVar11)) {
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        uVar13 = (int)((long)pGVar11 - (long)pGVar7 >> 2) * -0x55555555;
        p_00 = p->vLevels;
        Vec_IntFillExtra(p_00,uVar13 + 1,(int)pGVar7);
        if (((int)uVar13 < 0) || (p_00->nSize <= (int)uVar13)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        pDVar4->Level = p_00->pArray[uVar13 & 0x7fffffff];
      }
      else {
        uVar12 = uVar12 ^ uVar13;
        uVar10 = uVar10 ^ uVar2;
        if (((uVar10 ^ uVar12) == 1) ||
           (((uVar9 = uVar10, uVar12 == 1 || (uVar12 == uVar10)) || (uVar9 = uVar12, uVar10 == 1))))
        goto LAB_004f6efe;
        if ((p->nObjs <= (int)(uVar13 >> 1)) || ((uint)p->nObjs <= uVar2 >> 1)) goto LAB_004f70c2;
        uVar9 = Gia_ManHashLookup(p,(Gia_Obj_t *)
                                    ((ulong)(uVar12 & 1) ^ (ulong)(p->pObjs + (uVar13 >> 1))),
                                  (Gia_Obj_t *)
                                  ((ulong)(uVar10 & 1) ^ (ulong)(p->pObjs + (uVar2 >> 1))));
        if (uVar9 != 0) {
          (pDVar4->field_0).iGunc = uVar9;
          if ((int)uVar9 < 0) goto LAB_004f6f99;
          goto LAB_004f6f02;
        }
        (pDVar4->field_0).iGunc = -1;
      }
LAB_004f6f99:
      lVar18 = lVar18 + 1;
    } while (lVar18 < s_DarLib->nNodes0[Class]);
  }
  return;
}

Assistant:

void Dar2_LibEvalAssignNums( Gia_Man_t * p, int Class )
{
    Dar_LibObj_t * pObj;
    Dar_LibDat_t * pData, * pData0, * pData1;
    int iFanin0, iFanin1, i, iLit;
    for ( i = 0; i < s_DarLib->nNodes0[Class]; i++ )
    {
        // get one class node, assign its temporary number and set its data
        pObj = Dar_LibObj(s_DarLib, s_DarLib->pNodes0[Class][i]);
        pObj->Num = 4 + i;
        assert( (int)pObj->Num < s_DarLib->nNodes0Max + 4 );
        pData = s_DarLib->pDatas + pObj->Num;
        pData->fMffc = 0;
        pData->iGunc = -1;
        pData->TravId = 0xFFFF;

        // explore the fanins
        assert( (int)Dar_LibObj(s_DarLib, pObj->Fan0)->Num < s_DarLib->nNodes0Max + 4 );
        assert( (int)Dar_LibObj(s_DarLib, pObj->Fan1)->Num < s_DarLib->nNodes0Max + 4 );
        pData0 = s_DarLib->pDatas + Dar_LibObj(s_DarLib, pObj->Fan0)->Num;
        pData1 = s_DarLib->pDatas + Dar_LibObj(s_DarLib, pObj->Fan1)->Num;
        pData->Level = 1 + Abc_MaxInt(pData0->Level, pData1->Level);
        if ( pData0->iGunc == -1 || pData1->iGunc == -1 )
            continue;
        iFanin0 = Abc_LitNotCond( pData0->iGunc, pObj->fCompl0 );
        iFanin1 = Abc_LitNotCond( pData1->iGunc, pObj->fCompl1 );
        // compute the resulting literal
        if ( iFanin0 == 0 || iFanin1 == 0 || iFanin0 == Abc_LitNot(iFanin1) )
            iLit = 0;
        else if ( iFanin0 == 1 || iFanin0 == iFanin1 )
            iLit = iFanin1;
        else if ( iFanin1 == 1 )
            iLit = iFanin0;
        else
        {
            iLit = Gia_ManHashLookup( p, Gia_ObjFromLit(p, iFanin0), Gia_ObjFromLit(p, iFanin1) );
            if ( iLit == 0 )
                iLit = -1;
        }
        pData->iGunc = iLit;
        if ( pData->iGunc >= 0 )
        {
            // update the level to be more accurate
            pData->Level = Gia_ObjLevel( p, Gia_Regular(Gia_ObjFromLit(p, pData->iGunc)) );
            // mark the node if it is part of MFFC
//            pData->fMffc = Gia_ObjIsTravIdCurrentArray(p, Gia_Regular(pData->pGunc));
        }
    }
}